

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:432:36)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:432:36)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *pPVar1;
  SceneLoadingTutorialApplication *pSVar2;
  Vec3f L;
  undefined1 local_58 [16];
  function<void_()> local_48;
  pointer local_28;
  pointer ppStack_20;
  
  pPVar1 = cin->ptr;
  if (pPVar1 != (ParseStream *)0x0) {
    (*(pPVar1->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(pPVar1);
  }
  pSVar2 = (this->f).this;
  ParseStream::getVec3f((ParseStream *)local_58);
  local_28 = (pointer)local_58._0_8_;
  ppStack_20 = (pointer)0x0;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(SceneLoadingTutorialApplication **)local_48.super__Function_base._M_functor._M_unused._0_8_ =
       pSVar2;
  *(pointer *)((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 8) = local_28;
  *(undefined4 *)((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       local_58._8_4_;
  local_48._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:434:27)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:434:27)>
       ::_M_manager;
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)&pSVar2->futures
             ,&local_48);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  (*(pPVar1->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(pPVar1);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }